

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O2

void __thiscall LINAnalyzerSettings::LINAnalyzerSettings(LINAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_01;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_02;
  auto_ptr<AnalyzerSettingInterfaceInteger> *this_03;
  AnalyzerSettingInterfaceChannel *this_04;
  AnalyzerSettingInterfaceNumberList *this_05;
  AnalyzerSettingInterfaceInteger *this_06;
  ulong uVar1;
  Channel *pCVar2;
  char *pcVar3;
  uint uVar4;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__LINAnalyzerSettings_0010dd68;
  this_00 = &this->mInputChannel;
  uVar1 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mLINVersion = 2.0;
  this->mBitRate = 20000;
  this_01 = &this->mInputChannelInterface;
  this_02 = &this->mLINVersionInterface;
  this_03 = &this->mBitRateInterface;
  (this->mInputChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mLINVersionInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitRateInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  this_04 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar1);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_04);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_01,this_04);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01->_M_ptr,"Serial");
  pCVar2 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01->_M_ptr);
  this_05 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar2);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_05);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_02,this_05);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02->_M_ptr,"LIN Version");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_02->_M_ptr,"Version 1.x");
  pcVar3 = "Version 2.x";
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_02->_M_ptr,"Version 2.x");
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mLINVersion);
  this_06 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar3);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_06);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(this_03,this_06);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03->_M_ptr,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax((int)this_03->_M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)this_03->_M_ptr);
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar4 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar4,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

LINAnalyzerSettings::LINAnalyzerSettings() : mInputChannel( UNDEFINED_CHANNEL ), mLINVersion( 2.0 ), mBitRate( 20000 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Serial", "Standard LIN" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mLINVersionInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mLINVersionInterface->SetTitleAndTooltip( "LIN Version", "Specify the LIN protocol version 1 or 2." );
    mLINVersionInterface->AddNumber( 1.0, "Version 1.x", "LIN Protocol Specification Version 1.x" );
    mLINVersionInterface->AddNumber( 2.0, "Version 2.x", "LIN Protocol Specification Version 2.x" );
    mLINVersionInterface->SetNumber( mLINVersion );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 1000000 );
    mBitRateInterface->SetMin( 1000 );
    mBitRateInterface->SetInteger( mBitRate );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mLINVersionInterface.get() );
    AddInterface( mBitRateInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Serial", false );
}